

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O2

size_t quantize_iq3_s(float *src,void *dst,int64_t nrow,int64_t n_per_row,float *quant_weights)

{
  ggml_fp16_t *pgVar1;
  undefined8 *puVar2;
  int iVar3;
  uint32_t *grid;
  int *piVar4;
  uint16_t *puVar5;
  ggml_fp16_t gVar6;
  int i;
  long lVar7;
  long lVar8;
  float *pfVar9;
  float *pfVar10;
  byte *pbVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  int iVar16;
  char *pcVar17;
  byte *pbVar18;
  char *pcVar19;
  uint uVar20;
  uint uVar21;
  long lVar22;
  byte bVar23;
  byte bVar24;
  int i_1;
  long lVar25;
  int k_2;
  int8_t *piVar26;
  long lVar27;
  bool bVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  uint8_t block_signs [4];
  float *local_320;
  float *local_318;
  float *local_2e8;
  byte *local_2d8;
  float *local_2d0;
  ggml_fp16_t *local_2c0;
  ggml_fp16_t *local_2b8;
  float *local_2a8;
  _Bool is_on_grid_aux [8];
  _Bool is_on_grid [8];
  int8_t L [32];
  int8_t Laux [32];
  float scales [8];
  float xval [32];
  float weight [32];
  float waux [32];
  
  if ((char)n_per_row == '\0') {
    uVar20 = (int)n_per_row >> 8;
    if ((int)uVar20 < 1) {
      uVar20 = 0;
    }
    lVar7 = (n_per_row >> 8) * 0x6e;
    lVar27 = 0;
    if (0 < nrow) {
      lVar27 = nrow;
    }
    pbVar18 = (byte *)((long)dst + 0x6a);
    lVar22 = 0;
    local_2e8 = src;
    while( true ) {
      puVar5 = iq3_data[1].neighbours;
      piVar4 = iq3_data[1].map;
      grid = iq3_data[1].grid;
      if (lVar22 == lVar27) {
        return nrow * (n_per_row >> 8) * 0x6e;
      }
      if (iq3_data[1].grid == (uint32_t *)0x0) break;
      if (iq3_data[1].map == (int *)0x0) {
        pcVar19 = "kmap_q3xs && \"forgot to call ggml_quantize_init()?\"";
        iVar16 = 0xed6;
        goto LAB_0013a23a;
      }
      if (iq3_data[1].neighbours == (uint16_t *)0x0) {
        pcVar19 = "kneighbors_q3xs && \"forgot to call ggml_quantize_init()?\"";
        iVar16 = 0xed7;
        goto LAB_0013a23a;
      }
      local_318 = local_2e8;
      local_2d8 = pbVar18;
      local_2d0 = quant_weights;
      for (uVar14 = 0; uVar14 != uVar20; uVar14 = uVar14 + 1) {
        lVar8 = uVar14 * 0x6e;
        pgVar1 = (ggml_fp16_t *)((long)dst + lVar8);
        puVar2 = (undefined8 *)((long)dst + lVar8 + 0x5e);
        *puVar2 = 0;
        puVar2[1] = 0;
        puVar2 = (undefined8 *)((long)dst + lVar8 + 0x50);
        *puVar2 = 0;
        puVar2[1] = 0;
        puVar2 = (undefined8 *)((long)dst + lVar8 + 0x40);
        *puVar2 = 0;
        puVar2[1] = 0;
        puVar2 = (undefined8 *)((long)dst + lVar8 + 0x30);
        *puVar2 = 0;
        puVar2[1] = 0;
        puVar2 = (undefined8 *)((long)dst + lVar8 + 0x20);
        *puVar2 = 0;
        puVar2[1] = 0;
        puVar2 = (undefined8 *)((long)dst + lVar8 + 0x10);
        *puVar2 = 0;
        puVar2[1] = 0;
        *(undefined8 *)((long)dst + lVar8) = 0;
        ((undefined8 *)((long)dst + lVar8))[1] = 0;
        fVar32 = 0.0;
        for (lVar8 = 0; lVar8 != 0x100; lVar8 = lVar8 + 1) {
          fVar32 = fVar32 + local_318[lVar8] * local_318[lVar8];
        }
        local_2c0 = pgVar1 + 1;
        local_2b8 = pgVar1 + 0x25;
        fVar36 = 0.0;
        local_2a8 = local_2d0;
        local_320 = local_318;
        for (lVar8 = 0; lVar8 != 8; lVar8 = lVar8 + 1) {
          if (quant_weights == (float *)0x0) {
            for (lVar25 = 0; lVar25 != 0x20; lVar25 = lVar25 + 1) {
              weight[lVar25] = local_320[lVar25] * local_320[lVar25];
            }
          }
          else {
            for (lVar25 = 0; lVar25 != 0x20; lVar25 = lVar25 + 1) {
              fVar30 = local_2a8[lVar25];
              fVar29 = local_320[lVar25] * local_320[lVar25] + (fVar32 + fVar32) * 0.00390625;
              if (fVar29 < 0.0) {
                fVar29 = sqrtf(fVar29);
              }
              else {
                fVar29 = SQRT(fVar29);
              }
              weight[lVar25] = fVar30 * fVar29;
            }
          }
          for (lVar25 = 0; lVar25 != 0x20; lVar25 = lVar25 + 1) {
            fVar30 = weight[lVar25];
            if (fVar30 < 0.0) {
              fVar30 = sqrtf(fVar30);
            }
            else {
              fVar30 = SQRT(fVar30);
            }
            waux[lVar25] = fVar30;
          }
          pfVar9 = xval;
          pfVar10 = local_320;
          for (lVar25 = 0; lVar25 != 4; lVar25 = lVar25 + 1) {
            bVar24 = 0;
            for (lVar12 = 0; lVar12 != 8; lVar12 = lVar12 + 1) {
              fVar30 = pfVar10[lVar12];
              fVar33 = -fVar30;
              fVar29 = fVar33;
              if (fVar33 <= fVar30) {
                fVar29 = fVar30;
              }
              bVar23 = (byte)(1 << ((byte)lVar12 & 0x1f));
              if (fVar33 <= fVar30) {
                bVar23 = 0;
              }
              bVar24 = bVar23 | bVar24;
              pfVar9[lVar12] = fVar29;
            }
            block_signs[lVar25] = bVar24;
            pfVar10 = pfVar10 + 8;
            pfVar9 = pfVar9 + 8;
          }
          fVar30 = xval[0];
          for (lVar25 = 1; lVar25 != 0x20; lVar25 = lVar25 + 1) {
            if (fVar30 <= xval[lVar25]) {
              fVar30 = xval[lVar25];
            }
          }
          if ((fVar30 != 0.0) || (NAN(fVar30))) {
            for (lVar25 = 0; lVar25 != 8; lVar25 = lVar25 + 1) {
              is_on_grid[lVar25] = false;
            }
            fVar33 = fVar30 / 15.0;
            fVar29 = 0.0;
            iVar16 = -9;
            while( true ) {
              if (iVar16 == 10) break;
              fVar34 = ((float)iVar16 * 0.2 + 15.0) / fVar30;
              pfVar9 = xval;
              pcVar19 = Laux;
              for (lVar25 = 0; lVar25 != 8; lVar25 = lVar25 + 1) {
                for (lVar12 = 0; lVar12 != 4; lVar12 = lVar12 + 1) {
                  uVar15 = (uint)((pfVar9[lVar12] * fVar34 + -1.0) * 0.5 + 12582912.0) & 0x7fffff;
                  if (0x400006 < uVar15) {
                    uVar15 = 0x400007;
                  }
                  if (uVar15 < 0x400001) {
                    uVar15 = 0;
                  }
                  pcVar19[lVar12] = (char)uVar15;
                }
                uVar13 = 0;
                pcVar17 = pcVar19;
                for (lVar12 = 0; lVar12 != 0xc; lVar12 = lVar12 + 3) {
                  uVar13 = (ulong)((uint)uVar13 | (int)*pcVar17 << ((byte)lVar12 & 0x1f));
                  pcVar17 = pcVar17 + 1;
                }
                iVar3 = piVar4[uVar13 & 0xffff];
                is_on_grid_aux[lVar25] = true;
                if ((long)iVar3 < 0) {
                  is_on_grid_aux[lVar25] = false;
                  iq3_find_best_neighbour
                            (puVar5 + (-1 - (long)iVar3),grid,xval + lVar25 * 4,waux + lVar25 * 4,
                             1.0 / fVar34,(int8_t *)(scales + lVar25 + -8));
                }
                pcVar19 = pcVar19 + 4;
                pfVar9 = pfVar9 + 4;
              }
              fVar34 = 0.0;
              fVar31 = 0.0;
              for (lVar25 = 0; lVar25 != 0x20; lVar25 = lVar25 + 1) {
                fVar35 = (float)(Laux[lVar25] * 2 + 1);
                fVar34 = fVar34 + fVar35 * fVar35 * weight[lVar25];
                fVar31 = fVar31 + fVar35 * xval[lVar25] * weight[lVar25];
              }
              if (0.0 < fVar34) {
                if (fVar29 * fVar34 < fVar31 * fVar31) {
                  for (lVar25 = 0; lVar25 != 0x20; lVar25 = lVar25 + 1) {
                    L[lVar25] = Laux[lVar25];
                  }
                  for (lVar25 = 0; lVar25 != 8; lVar25 = lVar25 + 1) {
                    is_on_grid[lVar25] = is_on_grid_aux[lVar25];
                  }
                  fVar33 = fVar31 / fVar34;
                  fVar29 = fVar31 * fVar33;
                }
              }
              iVar16 = iVar16 + 1;
            }
            iVar16 = 0;
            for (lVar25 = 0; lVar25 != 8; lVar25 = lVar25 + 1) {
              iVar16 = iVar16 + (is_on_grid[lVar25] ^ 1);
            }
            if ((iVar16 != 0) && (0.0 < fVar33)) {
              piVar26 = L;
              pfVar9 = xval;
              for (lVar25 = 0; lVar25 != 8; lVar25 = lVar25 + 1) {
                uVar13 = 0;
                pfVar10 = pfVar9;
                for (lVar12 = 0; lVar12 != 0xc; lVar12 = lVar12 + 3) {
                  uVar15 = (uint)((*pfVar10 * (1.0 / fVar33) + -1.0) * 0.5 + 12582912.0) & 0x7fffff;
                  if (0x400006 < uVar15) {
                    uVar15 = 0x400007;
                  }
                  if (uVar15 < 0x400001) {
                    uVar15 = 0x400000;
                  }
                  uVar13 = (ulong)((uint)uVar13 | uVar15 << ((byte)lVar12 & 0x1f));
                  pfVar10 = pfVar10 + 1;
                }
                uVar15 = piVar4[uVar13 & 0xffff];
                if ((long)(int)uVar15 < 0) {
                  uVar15 = iq3_find_best_neighbour
                                     (puVar5 + (-1 - (long)(int)uVar15),grid,xval + lVar25 * 4,
                                      waux + lVar25 * 4,fVar33,L + lVar25 * 4);
                }
                for (lVar12 = 0; lVar12 != 4; lVar12 = lVar12 + 1) {
                  piVar26[lVar12] =
                       (int8_t)((int)(short)(*(char *)((long)grid + lVar12 + (ulong)uVar15 * 4) + -1
                                            ) / 2);
                }
                pfVar9 = pfVar9 + 4;
                piVar26 = piVar26 + 4;
              }
              fVar30 = 0.0;
              fVar29 = 0.0;
              for (lVar25 = 0; lVar25 != 0x20; lVar25 = lVar25 + 1) {
                fVar34 = (float)(L[lVar25] * 2 + 1);
                fVar30 = fVar30 + fVar34 * xval[lVar25] * weight[lVar25];
                fVar29 = fVar29 + fVar34 * fVar34 * weight[lVar25];
              }
              fVar33 = (float)(~-(uint)(0.0 < fVar29) & (uint)fVar33 |
                              (uint)(fVar30 / fVar29) & -(uint)(0.0 < fVar29));
            }
            if (fVar33 < 0.0) {
              for (lVar25 = 0; lVar25 != 4; lVar25 = lVar25 + 1) {
                block_signs[lVar25] = ~block_signs[lVar25];
              }
              fVar33 = -fVar33;
            }
            pcVar19 = L;
            for (lVar25 = 0; lVar25 != 8; lVar25 = lVar25 + 1) {
              uVar15 = 0;
              pcVar17 = pcVar19;
              for (lVar12 = 0; lVar12 != 0xc; lVar12 = lVar12 + 3) {
                uVar15 = uVar15 | (int)*pcVar17 << ((byte)lVar12 & 0x1f);
                pcVar17 = pcVar17 + 1;
              }
              uVar15 = piVar4[uVar15 & 0xffff];
              if ((int)uVar15 < 0) {
                printf("Oops: found point %u not on grid:");
                lVar27 = 4;
                while (bVar28 = lVar27 != 0, lVar27 = lVar27 + -1, bVar28) {
                  printf(" %d",(ulong)(uint)(int)*pcVar19);
                  pcVar19 = pcVar19 + 1;
                }
                putchar(10);
                ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-quants.c"
                           ,0xf59,"fatal error");
              }
              *(char *)((long)local_2c0 + lVar25) = (char)uVar15;
              pbVar11 = (byte *)((long)pgVar1 + lVar8 + 0x42);
              *pbVar11 = *pbVar11 | (byte)((uVar15 >> 8) << ((byte)lVar25 & 0x1f));
              pcVar19 = pcVar19 + 4;
            }
            for (lVar25 = 0; lVar25 != 4; lVar25 = lVar25 + 1) {
              *(uint8_t *)((long)local_2b8 + lVar25) = block_signs[lVar25];
            }
            if (fVar33 < 0.0) {
              pcVar19 = "scale >= 0";
              iVar16 = 0xf61;
              goto LAB_0013a23a;
            }
            local_2c0 = local_2c0 + 4;
            local_2b8 = local_2b8 + 2;
            scales[lVar8] = fVar33;
            if (fVar36 <= fVar33) {
              fVar36 = fVar33;
            }
          }
          else {
            scales[lVar8] = 0.0;
          }
          local_320 = local_320 + 0x20;
          local_2a8 = local_2a8 + 0x20;
        }
        if ((fVar36 != 0.0) || (NAN(fVar36))) {
          gVar6 = ggml_compute_fp32_to_fp16((fVar36 / 31.0) * 1.033);
          *pgVar1 = gVar6;
          fVar32 = 1.0 / (fVar36 / 31.0);
          pbVar11 = local_2d8;
          for (uVar13 = 0; uVar13 < 8; uVar13 = uVar13 + 2) {
            uVar15 = (uint)((scales[uVar13] * fVar32 + -1.0) * 0.5 + 12582912.0) & 0x7fffff;
            if (0x40000e < uVar15) {
              uVar15 = 0x40000f;
            }
            if (uVar15 < 0x400001) {
              uVar15 = 0;
            }
            uVar21 = (uint)((scales[uVar13 + 1] * fVar32 + -1.0) * 0.5 + 12582912.0) & 0x7fffff;
            if (0x40000e < uVar21) {
              uVar21 = 0x40000f;
            }
            if (uVar21 < 0x400001) {
              uVar21 = 0;
            }
            *pbVar11 = (byte)(uVar21 << 4) | (byte)uVar15;
            pbVar11 = pbVar11 + 1;
          }
        }
        local_318 = local_318 + 0x100;
        local_2d0 = local_2d0 + 0x100;
        local_2d8 = local_2d8 + 0x6e;
      }
      dst = (void *)((long)dst + lVar7);
      lVar22 = lVar22 + 1;
      local_2e8 = local_2e8 + n_per_row;
      pbVar18 = pbVar18 + lVar7;
    }
    pcVar19 = "kgrid_q3xs && \"forgot to call ggml_quantize_init()?\"";
    iVar16 = 0xed5;
  }
  else {
    pcVar19 = "n_per_row%QK_K == 0";
    iVar16 = 0xf7a;
  }
LAB_0013a23a:
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-quants.c",
             iVar16,"GGML_ASSERT(%s) failed",pcVar19);
}

Assistant:

size_t quantize_iq3_s(const float * GGML_RESTRICT src, void * GGML_RESTRICT dst, int64_t nrow, int64_t n_per_row, const float * quant_weights) {
    GGML_ASSERT(n_per_row%QK_K == 0);
    int64_t nblock = n_per_row/QK_K;
    float scales[QK_K/IQ3S_BLOCK_SIZE];
    float weight[IQ3S_BLOCK_SIZE];
    float xval[IQ3S_BLOCK_SIZE];
    int8_t L[IQ3S_BLOCK_SIZE];
    int8_t Laux[IQ3S_BLOCK_SIZE];
    float  waux[IQ3S_BLOCK_SIZE];
    bool   is_on_grid[IQ3S_BLOCK_SIZE/4];
    bool   is_on_grid_aux[IQ3S_BLOCK_SIZE/4];
    uint8_t block_signs[IQ3S_BLOCK_SIZE/8];
    char * qrow = (char *)dst;
    for (int64_t row = 0; row < nrow; ++row) {
        quantize_row_iq3_s_impl(IQ3S_BLOCK_SIZE, src, qrow, n_per_row, quant_weights,
                scales, weight, xval, L, Laux, waux, is_on_grid, is_on_grid_aux, block_signs);
        src += n_per_row;
        qrow += nblock*sizeof(block_iq3_s);
    }
    return nrow * nblock * sizeof(block_iq3_s);
}